

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::GenTableAccessorFuncBody
          (string *__return_storage_ptr__,RustGenerator *this,FieldDef *field,string *lifetime)

{
  bool bVar1;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator<char> local_101;
  undefined1 local_100 [8];
  string unwrap;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string default_value;
  undefined1 local_68 [8];
  string typname;
  string vt_offset;
  string *lifetime_local;
  FieldDef *field_local;
  RustGenerator *this_local;
  
  IdlNamer::LegacyRustFieldOffsetName_abi_cxx11_
            ((string *)((long)&typname.field_2 + 8),&this->namer_,field);
  FollowType((string *)local_68,this,&(field->value).type,lifetime);
  bVar1 = FieldDef::IsOptional(field);
  unwrap.field_2._M_local_buf[0xf] = '\0';
  unwrap.field_2._M_local_buf[0xe] = '\0';
  unwrap.field_2._M_local_buf[0xc] = '\0';
  if ((bVar1) || (bVar1 = FieldDef::IsRequired(field), bVar1)) {
    std::allocator<char>::allocator();
    unwrap.field_2._M_local_buf[0xc] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"None",(allocator<char> *)(unwrap.field_2._M_local_buf + 0xd));
  }
  else {
    GetDefaultValue_abi_cxx11_(&local_d8,this,field,kAccessor);
    unwrap.field_2._M_local_buf[0xf] = '\x01';
    std::operator+(&local_b8,"Some(",&local_d8);
    unwrap.field_2._M_local_buf[0xe] = '\x01';
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   &local_b8,")");
  }
  if ((unwrap.field_2._M_local_buf[0xc] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(unwrap.field_2._M_local_buf + 0xd));
  }
  if ((unwrap.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if ((unwrap.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  bVar1 = FieldDef::IsOptional(field);
  __s = ".unwrap()";
  if (bVar1) {
    __s = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_100,__s,&local_101);
  std::allocator<char>::~allocator(&local_101);
  std::operator+(&local_1e8,"unsafe { self._tab.get::<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  std::operator+(&local_1c8,&local_1e8,">({{STRUCT_TY}}::");
  std::operator+(&local_1a8,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&typname.field_2 + 8));
  std::operator+(&local_188,&local_1a8,", ");
  std::operator+(&local_168,&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::operator+(&local_148,&local_168,")");
  std::operator+(&local_128,&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  std::operator+(__return_storage_ptr__,&local_128,"}");
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(typname.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string GenTableAccessorFuncBody(const FieldDef &field,
                                       const std::string &lifetime) {
    const std::string vt_offset = namer_.LegacyRustFieldOffsetName(field);
    const std::string typname = FollowType(field.value.type, lifetime);
    // Default-y fields (scalars so far) are neither optional nor required.
    const std::string default_value =
        !(field.IsOptional() || field.IsRequired())
            ? "Some(" + GetDefaultValue(field, kAccessor) + ")"
            : "None";
    const std::string unwrap = field.IsOptional() ? "" : ".unwrap()";

    return "unsafe { self._tab.get::<" + typname +
           ">({{STRUCT_TY}}::" + vt_offset + ", " + default_value + ")" +
           unwrap + "}";
  }